

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_parse_headers.c
# Opt level: O2

IHEVCD_ERROR_T ihevcd_scaling_list_data(codec_t *ps_codec,WORD16 *pi2_scaling_mat)

{
  WORD16 *__dest;
  byte bVar1;
  void *pvVar2;
  WORD16 WVar3;
  UWORD32 UVar4;
  WORD32 WVar5;
  UWORD32 UVar6;
  UWORD32 UVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  WORD16 WVar16;
  ulong uVar17;
  bitstrm_t *ps_bitstrm;
  undefined1 auVar18 [16];
  
  ps_bitstrm = &(ps_codec->s_parse).s_bitstrm;
  uVar17 = 0;
  while (uVar10 = uVar17, uVar10 != 4) {
    bVar9 = (char)uVar10 * '\x02';
    uVar14 = 0x10 << (bVar9 & 0x1f);
    uVar15 = (ulong)uVar14;
    if (0x3f < uVar14) {
      uVar15 = 0x40;
    }
    for (lVar13 = 0; uVar17 = uVar10 + 1, lVar13 != (ulong)(uVar10 != 3) * 4 + 2;
        lVar13 = lVar13 + 1) {
      UVar4 = ihevcd_bits_get(ps_bitstrm,1);
      __dest = pi2_scaling_mat + *(int *)(&DAT_0016a500 + (uVar10 * 6 + lVar13) * 4);
      if (UVar4 == 0) {
        UVar6 = ihevcd_uev(ps_bitstrm);
        UVar4 = 0;
        if (0 < (int)UVar6) {
          UVar4 = UVar6;
        }
        UVar7 = (UWORD32)lVar13;
        if ((int)UVar6 <= lVar13) {
          UVar7 = UVar4;
        }
        if (UVar7 != 0) {
          memcpy(__dest,__dest + -(long)(int)(UVar7 << (bVar9 + 4 & 0x1f)),
                 (ulong)(uint)(0x20 << (bVar9 & 0x1f)));
        }
      }
      else if (uVar10 < 2) {
        pvVar2 = gapv_ihevc_invscan[uVar10 + 1];
        uVar17 = 8;
        for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
          WVar5 = ihevcd_sev(ps_bitstrm);
          uVar17 = (long)(WVar5 + (int)uVar17 + 0x100) % 0x100 & 0xffffffff;
          __dest[*(byte *)((long)pvVar2 + uVar12)] = (WORD16)uVar17;
        }
      }
      else {
        WVar5 = ihevcd_sev(ps_bitstrm);
        pvVar2 = gapv_ihevc_invscan[2];
        uVar17 = (ulong)(WVar5 + 8U);
        WVar3 = (WORD16)(WVar5 + 8U);
        if (uVar10 == 2) {
          for (uVar12 = 0; uVar15 != uVar12; uVar12 = uVar12 + 1) {
            WVar5 = ihevcd_sev(ps_bitstrm);
            bVar1 = *(byte *)((long)pvVar2 + uVar12);
            uVar8 = (ulong)(((uint)bVar1 + (uint)bVar1 & 0xe) + (bVar1 & 0xfffffff8) * 4);
            uVar17 = (long)(WVar5 + (int)uVar17 + 0x100) % 0x100 & 0xffffffff;
            WVar16 = (WORD16)uVar17;
            __dest[uVar8] = WVar16;
            __dest[uVar8 + 1] = WVar16;
            __dest[uVar8 + 0x10] = WVar16;
            __dest[uVar8 + 0x11] = WVar16;
          }
          *__dest = WVar3;
        }
        else {
          for (uVar12 = 0; uVar12 != uVar15; uVar12 = uVar12 + 1) {
            WVar5 = ihevcd_sev(ps_bitstrm);
            uVar8 = (long)(WVar5 + (int)uVar17 + 0x100) % 0x100;
            uVar14 = (uint)*(byte *)((long)pvVar2 + uVar12);
            uVar17 = uVar8 & 0xffffffff;
            auVar18 = ZEXT416((uint)uVar8);
            auVar18 = pshuflw(auVar18,auVar18,0);
            for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 0x40) {
              *(long *)((long)__dest +
                       lVar11 + (ulong)((uVar14 & 0xffffff8) * 0x10 + (uVar14 & 7) * 4) * 2) =
                   auVar18._0_8_;
            }
            *__dest = WVar3;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

IHEVCD_ERROR_T  ihevcd_scaling_list_data(codec_t *ps_codec, WORD16 *pi2_scaling_mat)
{
    IHEVCD_ERROR_T ret = (IHEVCD_ERROR_T)IHEVCD_SUCCESS;
    WORD32 size_id;
    WORD32 matrix_id;
    WORD32 value, dc_value = 0;
    WORD32 next_coef;
    WORD32 coef_num;
    WORD32 i, j, offset;
    bitstrm_t *ps_bitstrm = &ps_codec->s_parse.s_bitstrm;
    WORD16 *pi2_scaling_mat_offset;
    WORD32 scaling_mat_offset[] = { 0, 16, 32, 48, 64, 80, 96, 160, 224, 288, 352, 416, 480, 736, 992, 1248, 1504, 1760, 2016, 3040 };
    UWORD8 *scan_table;

    for(size_id = 0; size_id < 4; size_id++)
    {
        for(matrix_id = 0; matrix_id < ((size_id == 3) ? 2 : 6); matrix_id++)
        {
            WORD32 scaling_list_pred_mode_flag;
            WORD32 scaling_list_delta_coef;
            BITS_PARSE("scaling_list_pred_mode_flag", scaling_list_pred_mode_flag, ps_bitstrm, 1);

            offset = size_id * 6 + matrix_id;
            pi2_scaling_mat_offset = pi2_scaling_mat + scaling_mat_offset[offset];

            if(!scaling_list_pred_mode_flag)
            {
                WORD32 num_elements;
                UEV_PARSE("scaling_list_pred_matrix_id_delta", value,
                          ps_bitstrm);
                value = CLIP3(value, 0, matrix_id);

                num_elements = (1 << (4 + (size_id << 1)));
                if(0 != value)
                    memcpy(pi2_scaling_mat_offset, pi2_scaling_mat_offset - value * num_elements, num_elements * sizeof(WORD16));
            }
            else
            {
                next_coef = 8;
                coef_num = MIN(64, (1 << (4 + (size_id << 1))));

                if(size_id > 1)
                {
                    SEV_PARSE("scaling_list_dc_coef_minus8", value,
                              ps_bitstrm);

                    next_coef = value + 8;
                    dc_value = next_coef;
                }
                if(size_id < 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[size_id + 1];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;
                        pi2_scaling_mat_offset[scan_table[i]] = next_coef;
                    }
                }
                else if(size_id == 2)
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 16 * 2 + (offset & 0x7) * 2;
                        pi2_scaling_mat_offset[offset] = next_coef;
                        pi2_scaling_mat_offset[offset + 1] = next_coef;
                        pi2_scaling_mat_offset[offset + 16] = next_coef;
                        pi2_scaling_mat_offset[offset + 16 + 1] = next_coef;
                    }
                    pi2_scaling_mat_offset[0] = dc_value;
                }
                else
                {
                    scan_table = (UWORD8 *)gapv_ihevc_invscan[2];

                    for(i = 0; i < coef_num; i++)
                    {
                        SEV_PARSE("scaling_list_delta_coef",
                                  scaling_list_delta_coef, ps_bitstrm);
                        next_coef = (next_coef + scaling_list_delta_coef + 256)
                                        % 256;

                        offset = scan_table[i];
                        offset = (offset >> 3) * 32 * 4 + (offset & 0x7) * 4;

                        for(j = 0; j < 4; j++)
                        {
                            pi2_scaling_mat_offset[offset + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 1 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 2 + j * 32] = next_coef;
                            pi2_scaling_mat_offset[offset + 3 + j * 32] = next_coef;
                        }
                        pi2_scaling_mat_offset[0] = dc_value;
                    }
                }
            }
        }
    }

    return ret;
}